

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool ra_init_with_capacity(roaring_array_t *new_ra,uint32_t cap)

{
  void **ppvVar1;
  void *bigalloc;
  uint32_t cap_local;
  roaring_array_t *new_ra_local;
  
  if (new_ra == (roaring_array_t *)0x0) {
    new_ra_local._7_1_ = false;
  }
  else {
    ra_init(new_ra);
    if (cap < 0x80000000) {
      if (cap != 0) {
        ppvVar1 = (void **)malloc((ulong)cap * 0xb);
        if (ppvVar1 == (void **)0x0) {
          return false;
        }
        new_ra->containers = ppvVar1;
        new_ra->keys = (uint16_t *)(new_ra->containers + cap);
        new_ra->typecodes = (uint8_t *)(new_ra->keys + cap);
        new_ra->allocation_size = cap;
      }
      new_ra_local._7_1_ = true;
    }
    else {
      new_ra_local._7_1_ = false;
    }
  }
  return new_ra_local._7_1_;
}

Assistant:

bool ra_init_with_capacity(roaring_array_t *new_ra, uint32_t cap) {
    if (!new_ra) return false;
    ra_init(new_ra);

    if (cap > INT32_MAX) { return false; }

    if(cap > 0) {
      void *bigalloc = malloc(cap *
                (sizeof(uint16_t) + sizeof(container_t *) + sizeof(uint8_t)));
      if( bigalloc == NULL ) return false;
      new_ra->containers = (container_t **)bigalloc;
      new_ra->keys = (uint16_t *)(new_ra->containers + cap);
      new_ra->typecodes = (uint8_t *)(new_ra->keys + cap);
      // Narrowing is safe because of above check
      new_ra->allocation_size = (int32_t)cap;
    }
    return true;
}